

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  KeyValue *pKVar1;
  KeyValue *__src;
  KeyValue *__dest;
  size_t __n;
  int local_1c;
  
  local_1c = key;
  if ((short)this->flat_size_ < 0) {
    absl::lts_20240722::container_internal::
    btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                  *)(this->map_).flat,&local_1c);
  }
  else {
    pKVar1 = flat_end(this);
    __src = flat_begin(this);
    __n = (long)pKVar1 - (long)__src;
    do {
      __dest = __src;
      if (__dest == pKVar1) {
        return;
      }
      if (key < __dest->first) {
        return;
      }
      __src = __dest + 1;
      __n = __n - 0x20;
    } while (__dest->first != key);
    if (__src != pKVar1) {
      memmove(__dest,__src,__n);
    }
    this->flat_size_ = this->flat_size_ - 1;
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  for (KeyValue* it = flat_begin(); it != end && it->first <= key; ++it) {
    if (it->first == key) {
      std::copy(it + 1, end, it);
      --flat_size_;
      return;
    }
  }
}